

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mjs::hoisting_visitor::operator()(hoisting_visitor *this,try_statement *s)

{
  block_statement *pbVar1;
  block_statement *f;
  block_statement *c;
  try_statement *s_local;
  hoisting_visitor *this_local;
  
  pbVar1 = try_statement::block(s);
  accept<mjs::hoisting_visitor>(&pbVar1->super_statement,this);
  pbVar1 = try_statement::catch_block(s);
  if (pbVar1 != (block_statement *)0x0) {
    accept<mjs::hoisting_visitor>(&pbVar1->super_statement,this);
  }
  pbVar1 = try_statement::finally_block(s);
  if (pbVar1 != (block_statement *)0x0) {
    accept<mjs::hoisting_visitor>(&pbVar1->super_statement,this);
  }
  return;
}

Assistant:

void operator()(const try_statement& s) {
        accept(s.block(), *this);
        if (auto c = s.catch_block()) {
            accept(*c, *this);
        }
        if (auto f = s.finally_block()) {
            accept(*f, *this);
        }
    }